

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent.c
# Opt level: O0

void libssh2_agent_set_identity_path(LIBSSH2_AGENT *agent,char *path)

{
  size_t __n;
  char *__dest;
  char *path_buf;
  size_t path_len;
  char *path_local;
  LIBSSH2_AGENT *agent_local;
  
  if (agent->identity_agent_path != (char *)0x0) {
    (*agent->session->free)(agent->identity_agent_path,&agent->session->abstract);
    agent->identity_agent_path = (char *)0x0;
  }
  if ((path != (char *)0x0) && (__n = strlen(path), __n < 0xfffffffffffffffe)) {
    __dest = (char *)(*agent->session->alloc)(__n + 1,&agent->session->abstract);
    memcpy(__dest,path,__n);
    __dest[__n] = '\0';
    agent->identity_agent_path = __dest;
  }
  return;
}

Assistant:

LIBSSH2_API void
libssh2_agent_set_identity_path(LIBSSH2_AGENT *agent, const char *path)
{
    if(agent->identity_agent_path) {
        LIBSSH2_FREE(agent->session, agent->identity_agent_path);
        agent->identity_agent_path = NULL;
    }

    if(path) {
        size_t path_len = strlen(path);
        if(path_len < SIZE_MAX - 1) {
            char *path_buf = LIBSSH2_ALLOC(agent->session, path_len + 1);
            memcpy(path_buf, path, path_len);
            path_buf[path_len] = '\0';
            agent->identity_agent_path = path_buf;
        }
    }
}